

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

int __thiscall Fl_Input_::position(Fl_Input_ *this,int p,int m)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int p_00;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  was_up_down = 0;
  if (p < 1) {
    p = 0;
  }
  uVar3 = this->size_;
  uVar1 = uVar3;
  if (p < (int)uVar3) {
    uVar1 = p;
  }
  uVar11 = (ulong)uVar1;
  uVar6 = 0;
  if (0 < m) {
    uVar6 = m;
  }
  uVar2 = uVar3;
  if ((int)uVar6 < (int)uVar3) {
    uVar2 = uVar6;
  }
  uVar9 = (ulong)(int)uVar3;
  uVar10 = (ulong)(uint)p;
  if ((long)uVar9 < (long)(ulong)(uint)p) {
    uVar10 = uVar9;
  }
  while ((((iVar4 = (int)uVar11, 0 < iVar4 && (iVar4 < this->position_)) && (iVar4 < (int)uVar3)) &&
         (iVar4 = fl_utf8len(this->value_[uVar11]), iVar4 < 1))) {
    uVar11 = uVar11 - 1;
    uVar3 = this->size_;
    uVar10 = uVar10 - 1;
  }
  while( true ) {
    iVar4 = fl_utf8len(this->value_[uVar10]);
    uVar11 = (ulong)this->size_;
    if ((((long)uVar11 <= (long)uVar10) || ((long)uVar10 <= (long)this->position_)) || (-1 < iVar4))
    break;
    uVar10 = uVar10 + 1;
  }
  uVar12 = (ulong)uVar2;
  uVar8 = (ulong)uVar6;
  if ((long)uVar9 < (long)(ulong)uVar6) {
    uVar8 = uVar9;
  }
  while (((iVar4 = (int)uVar12, 0 < iVar4 && (iVar4 < this->mark_)) &&
         ((iVar4 < (int)uVar11 && (iVar4 = fl_utf8len(this->value_[uVar12]), iVar4 < 1))))) {
    uVar12 = uVar12 - 1;
    uVar8 = uVar8 - 1;
    uVar11 = (ulong)(uint)this->size_;
  }
  while( true ) {
    iVar5 = fl_utf8len(this->value_[uVar8]);
    iVar4 = this->mark_;
    if ((((long)this->size_ <= (long)uVar8) || ((long)uVar8 <= (long)iVar4)) || (-1 < iVar5)) break;
    uVar8 = uVar8 + 1;
  }
  iVar5 = (int)uVar10;
  if (uVar1 == uVar2) {
    uVar8 = uVar10;
  }
  iVar7 = (int)uVar8;
  p_00 = this->position_;
  if ((p_00 == iVar5) && (iVar7 == iVar4)) {
    return 0;
  }
  if (iVar7 == iVar5) {
    if (p_00 == iVar4) {
      if (((Fl_Input_ *)Fl::focus_ == this) && (((this->super_Fl_Widget).damage_ & 2) == 0)) {
        minimal_update(this,iVar4);
        this->erase_cursor_only = '\x01';
      }
      goto LAB_00186170;
    }
    if (p_00 <= iVar4) {
      iVar4 = p_00;
    }
  }
  else {
    if (p_00 != iVar5) {
      if (iVar5 < p_00) {
        p_00 = iVar5;
      }
      minimal_update(this,p_00);
      iVar4 = this->mark_;
    }
    if (iVar7 == iVar4) goto LAB_00186170;
    if (iVar7 < iVar4) {
      iVar4 = iVar7;
    }
  }
  minimal_update(this,iVar4);
LAB_00186170:
  this->position_ = iVar5;
  this->mark_ = iVar7;
  return 1;
}

Assistant:

int Fl_Input_::position(int p, int m) {
  int is_same = 0;
  was_up_down = 0;
  if (p<0) p = 0;
  if (p>size()) p = size();
  if (m<0) m = 0;
  if (m>size()) m = size();
  if (p == m) is_same = 1;

  while (p < position_ && p > 0 && (size() - p) > 0 &&
       (fl_utf8len((char)(value() + p)[0]) < 1)) { p--; }
  int ul = fl_utf8len((char)(value() + p)[0]);
  while (p < size() && p > position_ && ul < 0) {
       p++;
       ul = fl_utf8len((char)(value() + p)[0]);
  }

  while (m < mark_ && m > 0 && (size() - m) > 0 &&
       (fl_utf8len((char)(value() + m)[0]) < 1)) { m--; }
  ul = fl_utf8len((char)(value() + m)[0]);
  while (m < size() && m > mark_ && ul < 0) {
       m++;
       ul = fl_utf8len((char)(value() + m)[0]);
  }
  if (is_same) m = p;
  if (p == position_ && m == mark_) return 0;


  //if (Fl::selection_owner() == this) Fl::selection_owner(0);
  if (p != m) {
    if (p != position_) minimal_update(position_, p);
    if (m != mark_) minimal_update(mark_, m);
  } else {
    // new position is a cursor
    if (position_ == mark_) {
      // old position was just a cursor
      if (Fl::focus() == this && !(damage()&FL_DAMAGE_EXPOSE)) {
	minimal_update(position_); erase_cursor_only = 1;
      }
    } else { // old position was a selection
      minimal_update(position_, mark_);
    }
  }
  position_ = p;
  mark_ = m;
  return 1;
}